

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-close-order.c
# Opt level: O3

int run_test_close_order(void)

{
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  uv_loop_t *puVar2;
  uv_timer_t *puVar3;
  
  puVar2 = uv_default_loop();
  uv_check_init(puVar2,&check_handle);
  uv_check_start(&check_handle,check_cb);
  uv_timer_init(puVar2,&timer_handle1);
  uv_timer_start(&timer_handle1,timer_cb,0,0);
  uv_timer_init(puVar2,&timer_handle2);
  puVar3 = &timer_handle2;
  uv_timer_start(&timer_handle2,timer_cb,100000,0);
  if (check_cb_called == 0) {
    if (close_cb_called != 0) goto LAB_0014a797;
    if (timer_cb_called != 0) goto LAB_0014a79c;
    uv_run(puVar2,UV_RUN_DEFAULT);
    if (check_cb_called != 1) goto LAB_0014a7a1;
    if (close_cb_called != 3) goto LAB_0014a7a6;
    if (timer_cb_called != 1) goto LAB_0014a7ab;
    puVar2 = uv_default_loop();
    uv_walk(puVar2,close_walk_cb,(void *)0x0);
    uv_run(puVar2,UV_RUN_DEFAULT);
    puVar2 = uv_default_loop();
    iVar1 = uv_loop_close(puVar2);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    run_test_close_order_cold_1();
LAB_0014a797:
    run_test_close_order_cold_2();
LAB_0014a79c:
    puVar2 = (uv_loop_t *)puVar3;
    run_test_close_order_cold_3();
LAB_0014a7a1:
    run_test_close_order_cold_4();
LAB_0014a7a6:
    run_test_close_order_cold_5();
LAB_0014a7ab:
    run_test_close_order_cold_6();
  }
  run_test_close_order_cold_7();
  if (check_cb_called == 0) {
    if (timer_cb_called == 1) {
      if (close_cb_called == 0) {
        uv_close((uv_handle_t *)puVar2,close_cb);
        uv_close((uv_handle_t *)&timer_handle2,close_cb);
        check_cb_called = check_cb_called + 1;
        return extraout_EAX;
      }
      goto LAB_0014a801;
    }
  }
  else {
    check_cb_cold_1();
  }
  check_cb_cold_2();
LAB_0014a801:
  check_cb_cold_3();
  uv_close((uv_handle_t *)puVar2,close_cb);
  timer_cb_called = timer_cb_called + 1;
  return extraout_EAX_00;
}

Assistant:

TEST_IMPL(close_order) {
  uv_loop_t* loop;
  loop = uv_default_loop();

  uv_check_init(loop, &check_handle);
  uv_check_start(&check_handle, check_cb);
  uv_timer_init(loop, &timer_handle1);
  uv_timer_start(&timer_handle1, timer_cb, 0, 0);
  uv_timer_init(loop, &timer_handle2);
  uv_timer_start(&timer_handle2, timer_cb, 100000, 0);

  ASSERT(check_cb_called == 0);
  ASSERT(close_cb_called == 0);
  ASSERT(timer_cb_called == 0);

  uv_run(loop, UV_RUN_DEFAULT);

  ASSERT(check_cb_called == 1);
  ASSERT(close_cb_called == 3);
  ASSERT(timer_cb_called == 1);

  MAKE_VALGRIND_HAPPY();
  return 0;
}